

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities_impl.hpp
# Opt level: O0

string * websocketpp::utility::to_hex_abi_cxx11_(uint8_t *input,size_t length)

{
  char *pcVar1;
  ulong in_RDX;
  string *in_RDI;
  size_t i;
  string hex;
  string *output;
  ulong local_60;
  allocator local_41;
  string local_40 [39];
  byte local_19;
  ulong local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"0123456789ABCDEF",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  for (local_60 = 0; local_60 < local_18; local_60 = local_60 + 1) {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    std::__cxx11::string::operator+=((string *)in_RDI,*pcVar1);
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    std::__cxx11::string::operator+=((string *)in_RDI,*pcVar1);
    std::__cxx11::string::operator+=((string *)in_RDI," ");
  }
  local_19 = 1;
  std::__cxx11::string::~string(local_40);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)in_RDI);
  }
  return in_RDI;
}

Assistant:

inline std::string to_hex(uint8_t const * input, size_t length) {
    std::string output;
    std::string hex = "0123456789ABCDEF";

    for (size_t i = 0; i < length; i++) {
        output += hex[(input[i] & 0xF0) >> 4];
        output += hex[input[i] & 0x0F];
        output += " ";
    }

    return output;
}